

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O2

void __thiscall Assimp::ColladaParser::ThrowException(ColladaParser *this,string *pError)

{
  DeadlyImportError *this_00;
  string sStack_1b8;
  ostringstream local_198 [376];
  
  this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::__cxx11::ostringstream::ostringstream(local_198);
  std::operator<<((ostream *)local_198,"Collada: ");
  std::operator<<((ostream *)local_198,(string *)this);
  std::operator<<((ostream *)local_198," - ");
  std::operator<<((ostream *)local_198,(string *)pError);
  std::__cxx11::stringbuf::str();
  DeadlyImportError::DeadlyImportError(this_00,&sStack_1b8);
  __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

AI_WONT_RETURN void ColladaParser::ThrowException(const std::string& pError) const {
    throw DeadlyImportError(format() << "Collada: " << mFileName << " - " << pError);
}